

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

FeatureVector *
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependencies
          (FeatureVector *__return_storage_ptr__,Feature feature)

{
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature> init;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature> init_00;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature> init_01;
  initializer_list<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature> init_02;
  Feature local_7c;
  iterator local_78;
  undefined8 local_70;
  Feature local_64;
  iterator local_60;
  undefined8 local_58;
  Feature local_4c [3];
  iterator local_40;
  undefined8 local_38;
  Feature local_30 [2];
  iterator local_28;
  undefined8 local_20;
  Feature local_14;
  FeatureVector *pFStack_10;
  Feature feature_local;
  
  local_14 = feature;
  pFStack_10 = __return_storage_ptr__;
  switch(feature) {
  case SubgroupAllEqualT:
    local_30[0] = SubgroupBrodcast_First;
    local_30[1] = 7;
    local_28 = local_30;
    local_20 = 2;
    init_02._M_len = 2;
    init_02._M_array = local_28;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::SmallVector
              (__return_storage_ptr__,init_02);
    break;
  case SubgroupElect:
    local_4c[0] = SubgroupBallotFindLSB_MSB;
    local_4c[1] = 0xc;
    local_4c[2] = 2;
    local_40 = local_4c;
    local_38 = 3;
    init_01._M_len = 3;
    init_01._M_array = local_40;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::SmallVector
              (__return_storage_ptr__,init_01);
    break;
  default:
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::SmallVector
              (__return_storage_ptr__);
    break;
  case SubgroupInverseBallot_InclBitCount_ExclBitCout:
    local_64 = SubgroupMask;
    local_60 = &local_64;
    local_58 = 1;
    init_00._M_len = 1;
    init_00._M_array = local_60;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::SmallVector
              (__return_storage_ptr__,init_00);
    break;
  case SubgroupBallotBitCount:
    local_7c = SubgroupBallot;
    local_78 = &local_7c;
    local_70 = 1;
    init._M_len = 1;
    init._M_array = local_78;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::SmallVector
              (__return_storage_ptr__,init);
  }
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::FeatureVector
CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependencies(Feature feature)
{
	switch (feature)
	{
	case SubgroupAllEqualT:
		return { SubgroupBrodcast_First, SubgroupAll_Any_AllEqualBool };
	case SubgroupElect:
		return { SubgroupBallotFindLSB_MSB, SubgroupBallot, SubgroupInvocationID };
	case SubgroupInverseBallot_InclBitCount_ExclBitCout:
		return { SubgroupMask };
	case SubgroupBallotBitCount:
		return { SubgroupBallot };
	default:
		return {};
	}
}